

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_glsl.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLint GVar5;
  GLFWwindow *handle;
  char *__format;
  long lVar6;
  GLint stat;
  GLsizei local_41c;
  char log [1000];
  
  iVar1 = 2;
  for (lVar6 = 1; lVar6 < argc; lVar6 = lVar6 + 1) {
    iVar1 = atoi(argv[lVar6]);
  }
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x2200b,0x36002);
  glfwWindowHint(0x22001,0x30002);
  glfwWindowHint(0x22002,iVar1);
  handle = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    iVar1 = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    iVar1 = gladLoadGLES2Loader(glfwGetProcAddress);
    if (iVar1 != 0) {
      (*glad_glClearColor)(0.3,0.1,0.3,1.0);
      GVar2 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar2,1,&create_shaders()::fragShaderText,(GLint *)0x0);
      (*glad_glCompileShader)(GVar2);
      (*glad_glGetShaderiv)(GVar2,0x8b81,&stat);
      if (stat == 0) {
        (*glad_glGetShaderInfoLog)(GVar2,1000,&local_41c,log);
        __format = "error: compiling fragment shader:\n%s\n";
      }
      else {
        GVar3 = (*glad_glCreateShader)(0x8b31);
        (*glad_glShaderSource)(GVar3,1,&create_shaders()::vertShaderText,(GLint *)0x0);
        (*glad_glCompileShader)(GVar3);
        (*glad_glGetShaderiv)(GVar3,0x8b81,&stat);
        if (stat == 0) {
          (*glad_glGetShaderInfoLog)(GVar3,1000,&local_41c,log);
          __format = "error: compiling vertex shader:\n%s\n";
        }
        else {
          GVar4 = (*glad_glCreateProgram)();
          (*glad_glAttachShader)(GVar4,GVar2);
          (*glad_glAttachShader)(GVar4,GVar3);
          (*glad_glBindAttribLocation)(GVar4,attr_pos,"pos");
          (*glad_glBindAttribLocation)(GVar4,attr_color,"color");
          (*glad_glLinkProgram)(GVar4);
          (*glad_glGetProgramiv)(GVar4,0x8b82,&stat);
          if (stat != 0) {
            (*glad_glUseProgram)(GVar4);
            attr_pos = (*glad_glGetAttribLocation)(GVar4,"pos");
            attr_color = (*glad_glGetAttribLocation)(GVar4,"color");
            GVar5 = (*glad_glGetUniformLocation)(GVar4,"modelviewProjection");
            glfwGetFramebufferSize(handle,(int *)log,&stat);
            (*glad_glViewport)(0,0,log._0_4_,stat);
            log[8] = '\0';
            log[9] = '\0';
            log[10] = '\0';
            log[0xb] = '\0';
            log[0xc] = '\0';
            log[0xd] = '\0';
            log[0xe] = '\0';
            log[0xf] = '\0';
            log[0x18] = '\0';
            log[0x19] = '\0';
            log[0x1a] = '\0';
            log[0x1b] = '\0';
            log[0x1c] = '\0';
            log[0x1d] = '\0';
            log[0x1e] = '\0';
            log[0x1f] = '\0';
            log[0x20] = '\0';
            log[0x21] = '\0';
            log[0x22] = '\0';
            log[0x23] = '\0';
            log[0x24] = '\0';
            log[0x25] = '\0';
            log[0x26] = '\0';
            log[0x27] = '\0';
            log[0x30] = '\0';
            log[0x31] = '\0';
            log[0x32] = '\0';
            log[0x33] = '\0';
            log[0x34] = '\0';
            log[0x35] = '\0';
            log[0x36] = '\0';
            log[0x37] = '\0';
            log[0] = '\0';
            log[1] = '\0';
            log[2] = -0x80;
            log[3] = '?';
            log[4] = '\0';
            log[5] = '\0';
            log[6] = '\0';
            log[7] = '\0';
            log[0x10] = '\0';
            log[0x11] = '\0';
            log[0x12] = '\0';
            log[0x13] = '\0';
            log[0x14] = '\0';
            log[0x15] = '\0';
            log[0x16] = -0x80;
            log[0x17] = '?';
            log[0x28] = '\0';
            log[0x29] = '\0';
            log[0x2a] = -0x80;
            log[0x2b] = '?';
            log[0x2c] = '\0';
            log[0x2d] = '\0';
            log[0x2e] = '\0';
            log[0x2f] = '\0';
            log[0x38] = '\0';
            log[0x39] = '\0';
            log[0x3a] = '\0';
            log[0x3b] = '\0';
            log[0x3c] = '\0';
            log[0x3d] = '\0';
            log[0x3e] = -0x80;
            log[0x3f] = '?';
            (*glad_glUniformMatrix4fv)(GVar5,1,'\0',(GLfloat *)log);
            (*glad_glClear)(0x4000);
            (*glad_glVertexAttribPointer)(attr_pos,2,0x1406,'\0',0,draw()::verts);
            (*glad_glVertexAttribPointer)(attr_color,3,0x1406,'\0',0,draw()::colors);
            (*glad_glEnableVertexAttribArray)(attr_pos);
            (*glad_glEnableVertexAttribArray)(attr_color);
            (*glad_glDrawArrays)(4,0,3);
            (*glad_glDisableVertexAttribArray)(attr_pos);
            (*glad_glDisableVertexAttribArray)(attr_color);
            glfwSwapBuffers(handle);
            glfwDestroyWindow(handle);
            glfwTerminate();
            return 0;
          }
          (*glad_glGetProgramInfoLog)(GVar4,1000,&local_41c,log);
          __format = "error: linking:\n%s\n";
        }
      }
      fprintf(_stderr,__format,log);
      exit(1);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
main(int argc, char *argv[])
{
    int version_major = 2;

    int i;

    for (i = 1; i < argc; ++i) {
         version_major = atoi(argv[i]);
    }

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
    glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, version_major);

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLES2Loader((GLADloadproc)glfwGetProcAddress)) {
        return EXIT_FAILURE;
    }

    init();
    reshape();
    draw();

    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}